

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflection_ops.cc
# Opt level: O1

void google::protobuf::internal::ReflectionOps::DiscardUnknownFields(Message *message)

{
  byte bVar1;
  FieldDescriptor *this;
  TaggedPtr p;
  bool bVar2;
  int iVar3;
  Reflection *this_00;
  SooRep *pSVar4;
  MapFieldBase *this_01;
  Descriptor *pDVar5;
  ReflectionPayload *pRVar6;
  Message *pMVar7;
  Nonnull<const_char_*> pcVar8;
  int index;
  pointer ppFVar9;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  fields;
  MapIterator iter;
  MapIterator end;
  vector<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  local_e8;
  pointer local_c8;
  MapIterator local_c0;
  MapIterator local_78;
  
  this_00 = GetReflectionOrDie(message);
  pSVar4 = (SooRep *)Reflection::GetUnknownFields(this_00,message);
  iVar3 = SooRep::size(pSVar4,(undefined1  [16])
                              ((undefined1  [16])pSVar4->field_0 & (undefined1  [16])0x4) ==
                              (undefined1  [16])0x0);
  if (iVar3 != 0) {
    pSVar4 = (SooRep *)Reflection::MutableUnknownFields(this_00,message);
    iVar3 = SooRep::size(pSVar4,(undefined1  [16])
                                ((undefined1  [16])pSVar4->field_0 & (undefined1  [16])0x4) ==
                                (undefined1  [16])0x0);
    if (iVar3 != 0) {
      UnknownFieldSet::ClearFallback((UnknownFieldSet *)pSVar4);
    }
  }
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e8.
  super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  Reflection::ListFields(this_00,message,&local_e8);
  local_c8 = local_e8.
             super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
             ._M_impl.super__Vector_impl_data._M_finish;
  ppFVar9 = local_e8.
            super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if (local_e8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_e8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    do {
      this = *ppFVar9;
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)this->type_ * 4) == 10) {
        if ((this->type_ == 0xb) && (bVar2 = FieldDescriptor::is_map_message_type(this), bVar2)) {
          this_01 = Reflection::MutableMapData(this_00,message,this);
        }
        else {
          this_01 = (MapFieldBase *)0x0;
        }
        if ((this_01 == (MapFieldBase *)0x0) || (bVar2 = MapFieldBase::IsMapValid(this_01), !bVar2))
        {
          bVar1 = this->field_0x1;
          bVar2 = (bool)((bVar1 & 0x20) >> 5);
          if (0xbf < bVar1 == bVar2) {
            pcVar8 = (Nonnull<const_char_*>)0x0;
          }
          else {
            pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<bool,bool>
                               (bVar2,0xbf < bVar1,
                                "is_repeated_ == static_cast<Label>(label_) == LABEL_REPEATED");
          }
          if (pcVar8 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xb54,pcVar8);
LAB_0030224a:
            absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                      ((LogMessageFatal *)&local_c0);
          }
          if ((this->field_0x1 & 0x20) == 0) {
            pMVar7 = Reflection::MutableMessage(this_00,message,this,(MessageFactory *)0x0);
            Message::DiscardUnknownFields(pMVar7);
          }
          else {
            iVar3 = Reflection::FieldSize(this_00,message,this);
            if (0 < iVar3) {
              index = 0;
              do {
                pMVar7 = Reflection::MutableRepeatedMessage(this_00,message,this,index);
                Message::DiscardUnknownFields(pMVar7);
                index = index + 1;
              } while (iVar3 != index);
            }
          }
        }
        else {
          pDVar5 = FieldDescriptor::message_type(this);
          if ((long)pDVar5->field_count_ < 2) {
            pcVar8 = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                               (1,(long)pDVar5->field_count_,"index < field_count()");
          }
          else {
            pcVar8 = (Nonnull<const_char_*>)0x0;
          }
          if (pcVar8 != (Nonnull<const_char_*>)0x0) {
            absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                      ((LogMessageFatal *)&local_c0,
                       "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/descriptor.h"
                       ,0xa88,pcVar8);
            goto LAB_0030224a;
          }
          if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)pDVar5->fields_[1].type_ * 4) ==
              10) {
            MapIterator::MapIterator(&local_c0,message,this);
            MapIterator::MapIterator(&local_78,message,this);
            MapFieldBase::MapBegin(this_01,&local_c0);
            MapFieldBase::MapEnd(this_01,&local_78);
            while (bVar2 = MapFieldBase::EqualIterator(local_c0.map_,&local_c0,&local_78), !bVar2) {
              p = ((local_c0.map_)->super_MapFieldBaseForParse).payload_._M_i;
              if ((p & 1) == 0) {
                pRVar6 = (ReflectionPayload *)0x0;
              }
              else {
                pRVar6 = MapFieldBase::ToPayload(p);
              }
              if (pRVar6 != (ReflectionPayload *)0x0) {
                (pRVar6->state)._M_i = STATE_MODIFIED_MAP;
              }
              pMVar7 = MapValueRef::MutableMessageValue(&local_c0.value_);
              Message::DiscardUnknownFields(pMVar7);
              MapFieldBase::IncreaseIterator(local_c0.map_,&local_c0);
            }
          }
        }
      }
      ppFVar9 = ppFVar9 + 1;
    } while (ppFVar9 != local_c8);
  }
  if (local_e8.
      super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_e8.
                    super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_e8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_e8.
                          super__Vector_base<const_google::protobuf::FieldDescriptor_*,_std::allocator<const_google::protobuf::FieldDescriptor_*>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

void ReflectionOps::DiscardUnknownFields(Message* message) {
  const Reflection* reflection = GetReflectionOrDie(*message);

  if (reflection->GetUnknownFields(*message).field_count() != 0) {
    reflection->MutableUnknownFields(message)->Clear();
  }

  // Walk through the fields of this message and DiscardUnknownFields on any
  // messages present.
  std::vector<const FieldDescriptor*> fields;
  reflection->ListFields(*message, &fields);
  for (const FieldDescriptor* field : fields) {
    // Skip over non-message fields.
    if (field->cpp_type() != FieldDescriptor::CPPTYPE_MESSAGE) {
      continue;
    }
    // Discard the unknown fields in maps that contain message values.
    const MapFieldBase* map_field =
        field->is_map() ? reflection->MutableMapData(message, field) : nullptr;
    if (map_field != nullptr && map_field->IsMapValid()) {
      if (IsMapValueMessageTyped(field)) {
        MapIterator iter(message, field);
        MapIterator end(message, field);
        for (map_field->MapBegin(&iter), map_field->MapEnd(&end); iter != end;
             ++iter) {
          iter.MutableValueRef()->MutableMessageValue()->DiscardUnknownFields();
        }
      }
      // Discard every unknown field inside messages in a repeated field.
    } else if (field->is_repeated()) {
      int size = reflection->FieldSize(*message, field);
      for (int j = 0; j < size; j++) {
        reflection->MutableRepeatedMessage(message, field, j)
            ->DiscardUnknownFields();
      }
      // Discard the unknown fields inside an optional message.
    } else {
      reflection->MutableMessage(message, field)->DiscardUnknownFields();
    }
  }
}